

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# procs.hpp
# Opt level: O1

void __thiscall
henson::ProcMap::Level::Level
          (Level *this,MPI_Comm world_,MPI_Comm param_2,GroupMap *groups_,int color_,string *group_,
          IntercommCache *cache_)

{
  pointer pcVar1;
  
  this->world = world_;
  this->local = param_2;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_henson::ProcMap::Group>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_henson::ProcMap::Group>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_henson::ProcMap::Group>_>_>
  ::_Rb_tree(&(this->groups)._M_t,&groups_->_M_t);
  this->color = color_;
  (this->group)._M_dataplus._M_p = (pointer)&(this->group).field_2;
  pcVar1 = (group_->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->group,pcVar1,pcVar1 + group_->_M_string_length);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_henson::ProcMap::InterIntraComm>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_henson::ProcMap::InterIntraComm>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_henson::ProcMap::InterIntraComm>_>_>
  ::_Rb_tree(&(this->intercomm_cache)._M_t,&cache_->_M_t);
  return;
}

Assistant:

Level(MPI_Comm world_, MPI_Comm local_, GroupMap groups_, int color_, std::string group_, IntercommCache cache_):
                world(world_), local(local_), groups(groups_), color(color_), group(group_), intercomm_cache(cache_)   {}